

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void __thiscall cmTarget::AddUtility(cmTarget *this,string *name,bool cross,cmMakefile *mf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var2;
  pointer pcVar3;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  size_type local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined1 local_68;
  BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  local_60;
  
  _Var2._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  pcVar3 = (name->_M_dataplus)._M_p;
  local_88 = &local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar3,pcVar3 + name->_M_string_length);
  local_68 = cross;
  if (mf == (cmMakefile *)0x0) {
    local_98.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_98.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_98);
  }
  else {
    cmMakefile::GetBacktrace(mf);
  }
  paVar1 = &local_60.Value.first.field_2;
  if (local_88 == &local_78) {
    local_60.Value.first.field_2._8_8_ = local_78._8_8_;
    local_60.Value.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_60.Value.first._M_dataplus._M_p = (pointer)local_88;
  }
  local_60.Value.first.field_2._M_allocated_capacity._1_7_ = local_78._M_allocated_capacity._1_7_;
  local_60.Value.first.field_2._M_local_buf[0] = local_78._M_local_buf[0];
  local_60.Value.first._M_string_length = local_80;
  local_80 = 0;
  local_78._M_local_buf[0] = '\0';
  local_60.Value.second = (bool)local_68;
  local_60.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_98.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_60.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       local_98.TopEntry.
       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  local_98.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_98.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_88 = &local_78;
  std::
  _Rb_tree<BT<std::pair<std::__cxx11::string,bool>>,BT<std::pair<std::__cxx11::string,bool>>,std::_Identity<BT<std::pair<std::__cxx11::string,bool>>>,std::less<BT<std::pair<std::__cxx11::string,bool>>>,std::allocator<BT<std::pair<std::__cxx11::string,bool>>>>
  ::_M_insert_unique<BT<std::pair<std::__cxx11::string,bool>>>
            ((_Rb_tree<BT<std::pair<std::__cxx11::string,bool>>,BT<std::pair<std::__cxx11::string,bool>>,std::_Identity<BT<std::pair<std::__cxx11::string,bool>>>,std::less<BT<std::pair<std::__cxx11::string,bool>>>,std::allocator<BT<std::pair<std::__cxx11::string,bool>>>>
              *)&(_Var2._M_head_impl)->Utilities,&local_60);
  if (local_60.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.Value.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.Value.first._M_dataplus._M_p,
                    local_60.Value.first.field_2._M_allocated_capacity + 1);
  }
  if (local_98.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88,CONCAT71(local_78._M_allocated_capacity._1_7_,local_78._M_local_buf[0])
                             + 1);
  }
  return;
}

Assistant:

void cmTarget::AddUtility(std::string const& name, bool cross, cmMakefile* mf)
{
  this->impl->Utilities.insert(BT<std::pair<std::string, bool>>(
    { name, cross }, mf ? mf->GetBacktrace() : cmListFileBacktrace()));
}